

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O0

FilterResult __thiscall
duckdb::FilterCombiner::AddFilter
          (FilterCombiner *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RSI;
  FilterResult result;
  Expression *in_stack_00000390;
  FilterCombiner *in_stack_00000398;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *this_00;
  FilterResult local_4;
  
  this_00 = in_RSI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)in_RSI
            );
  local_4 = AddFilter(in_stack_00000398,in_stack_00000390);
  if (local_4 == UNSUPPORTED) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::push_back(this_00,(value_type *)in_RSI);
    local_4 = SUCCESS;
  }
  return local_4;
}

Assistant:

FilterResult FilterCombiner::AddFilter(unique_ptr<Expression> expr) {
	//	LookUpConjunctions(expr.get());
	// try to push the filter into the combiner
	auto result = AddFilter(*expr);
	if (result == FilterResult::UNSUPPORTED) {
		// unsupported filter, push into remaining filters
		remaining_filters.push_back(std::move(expr));
		return FilterResult::SUCCESS;
	}
	return result;
}